

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int saveAllCursors(BtShared *pBt,Pgno iRoot,BtCursor *pExcept)

{
  BtCursor *in_RDX;
  Pgno in_ESI;
  long in_RDI;
  BtCursor *p;
  BtCursor *pExcept_00;
  undefined4 in_stack_ffffffffffffffe8;
  int local_4;
  
  for (pExcept_00 = *(BtCursor **)(in_RDI + 0x10);
      (pExcept_00 != (BtCursor *)0x0 &&
      ((pExcept_00 == in_RDX || ((in_ESI != 0 && (pExcept_00->pgnoRoot != in_ESI))))));
      pExcept_00 = pExcept_00->pNext) {
  }
  if (pExcept_00 == (BtCursor *)0x0) {
    if (in_RDX != (BtCursor *)0x0) {
      in_RDX->curFlags = in_RDX->curFlags & 0xdf;
    }
    local_4 = 0;
  }
  else {
    local_4 = saveCursorsOnList((BtCursor *)CONCAT44(in_ESI,in_stack_ffffffffffffffe8),
                                (Pgno)((ulong)in_RDX >> 0x20),pExcept_00);
  }
  return local_4;
}

Assistant:

static int saveAllCursors(BtShared *pBt, Pgno iRoot, BtCursor *pExcept){
  BtCursor *p;
  assert( sqlite3_mutex_held(pBt->mutex) );
  assert( pExcept==0 || pExcept->pBt==pBt );
  for(p=pBt->pCursor; p; p=p->pNext){
    if( p!=pExcept && (0==iRoot || p->pgnoRoot==iRoot) ) break;
  }
  if( p ) return saveCursorsOnList(p, iRoot, pExcept);
  if( pExcept ) pExcept->curFlags &= ~BTCF_Multiple;
  return SQLITE_OK;
}